

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkfile_p.cpp
# Opt level: O0

void QNetworkFile::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QString *_t2;
  QMetaType QVar2;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int iVar3;
  char *in_RSI;
  QNetworkFile *in_RDI;
  long in_FS_OFFSET;
  QNetworkFile *_t;
  QNetworkFile *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  NetworkError _t1;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)in_RSI;
  if (iVar3 == 0) {
    _t2 = (QString *)(ulong)in_EDX;
    _t1 = (NetworkError)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    switch(_t2) {
    case (QString *)0x0:
      finished((QNetworkFile *)0x1c48de,false);
      break;
    case (QString *)0x1:
      headerRead(in_stack_ffffffffffffff90,_t1,(QByteArray *)_t2);
      break;
    case (QString *)0x2:
      networkError(in_stack_ffffffffffffff90,_t1,_t2);
      break;
    case (QString *)0x3:
      open(in_RDI,in_RSI,in_EDX);
      break;
    case (QString *)0x4:
      (**(code **)(*(long *)in_RDI + 0x70))();
    }
  }
  if (iVar3 == 7) {
    if (in_EDX == 2) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar2 = QMetaType::fromType<QNetworkReply::NetworkError>();
        **(undefined8 **)in_RCX = QVar2.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if (((iVar3 == 5) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QNetworkFile::*)(bool)>
                         (in_RCX,(void **)finished,0,0), !bVar1)) &&
     (bVar1 = QtMocHelpers::
              indexOfMethod<void(QNetworkFile::*)(QHttpHeaders::WellKnownHeader,QByteArray_const&)>
                        (in_RCX,(void **)headerRead,0,1), !bVar1)) {
    QtMocHelpers::indexOfMethod<void(QNetworkFile::*)(QNetworkReply::NetworkError,QString_const&)>
              (in_RCX,(void **)networkError,0,2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkFile::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkFile *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->finished((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 1: _t->headerRead((*reinterpret_cast< std::add_pointer_t<QHttpHeaders::WellKnownHeader>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QByteArray>>(_a[2]))); break;
        case 2: _t->networkError((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->open(); break;
        case 4: _t->close(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(bool )>(_a, &QNetworkFile::finished, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QHttpHeaders::WellKnownHeader , const QByteArray & )>(_a, &QNetworkFile::headerRead, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QNetworkFile::*)(QNetworkReply::NetworkError , const QString & )>(_a, &QNetworkFile::networkError, 2))
            return;
    }
}